

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void regress_poly(reg_object obj,double *x,double *y,double *res,double *varcovar,double alpha)

{
  double *x_00;
  double dVar1;
  double *xx;
  int sum;
  int j;
  int i;
  int polydeg;
  double alpha_local;
  double *varcovar_local;
  double *res_local;
  double *y_local;
  double *x_local;
  reg_object obj_local;
  
  if (obj->intercept == 1) {
    j = obj->p + -1;
  }
  else {
    j = obj->p;
  }
  if (j < 1) {
    printf("The Value of p should be greater than or equal to 2");
    exit(1);
  }
  x_00 = (double *)malloc((long)obj->N * 8 * (long)j);
  for (sum = 0; sum < obj->N; sum = sum + 1) {
    x_00[sum] = x[sum];
  }
  xx._0_4_ = obj->N;
  for (sum = 1; sum < j; sum = sum + 1) {
    for (xx._4_4_ = 0; xx._4_4_ < obj->N; xx._4_4_ = xx._4_4_ + 1) {
      dVar1 = pow(x[xx._4_4_],(double)sum + 1.0);
      x_00[(int)xx + xx._4_4_] = (double)(int)dVar1;
    }
    xx._0_4_ = obj->N + (int)xx;
  }
  regress(obj,x_00,y,res,varcovar,alpha);
  free(x_00);
  return;
}

Assistant:

void regress_poly(reg_object obj, double *x, double *y, double *res, double *varcovar, double alpha) {
	int polydeg, i, j, sum;
	double *xx;
	/*
	* Performs polynomial regression of the form
	* Y = B0 + B1 * X + B2 * X^2 + ..... + B(p-1) * X ^(p-1)
	*
	* where p is defined as in regular regression
	* p = Number of dependent variables + Independent Variables
	*
	* For p = 3
	* regress_poly calculates coefficients of
	*
	* Y = B0 + B1 * X + B2 * X^2
	*
	*For more information see the functions regress and reg_init
	*/
	if (obj->intercept == 1) {
		polydeg = obj->p - 1;
	}
	else {
		polydeg = obj->p;
	}


	if (polydeg < 1) {
		printf("The Value of p should be greater than or equal to 2");
		exit(1);
	}

	xx = (double*)malloc(sizeof(double) * obj->N * polydeg);
	for (i = 0; i < obj->N; i++)
		xx[i] = x[i];
	sum = obj->N;
	for (i = 1; i < polydeg; ++i) {
		for (j = 0; j < obj->N; ++j) {
			xx[sum + j] = (int)pow((double)x[j], (double)i + 1.);
		}
		sum += obj->N;
	}
	regress(obj, xx, y, res, varcovar, alpha);

	free(xx);
}